

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O0

aiNode * __thiscall Assimp::M3DImporter::findNode(M3DImporter *this,aiNode *pNode,aiString *name)

{
  bool bVar1;
  aiNode *paVar2;
  aiString local_43c;
  undefined8 local_38;
  aiNode *pChild;
  aiString *paStack_28;
  uint i;
  aiString *name_local;
  aiNode *pNode_local;
  M3DImporter *this_local;
  
  paStack_28 = name;
  name_local = &pNode->mName;
  pNode_local = (aiNode *)this;
  if (pNode == (aiNode *)0x0) {
    __assert_fail("pNode != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x27a,"aiNode *Assimp::M3DImporter::findNode(aiNode *, aiString)");
  }
  if (this->mScene != (aiScene *)0x0) {
    bVar1 = aiString::operator==(&pNode->mName,name);
    if (bVar1) {
      this_local = (M3DImporter *)name_local;
    }
    else {
      for (pChild._4_4_ = 0; pChild._4_4_ < *(uint *)(name_local[1].data + 0x48);
          pChild._4_4_ = pChild._4_4_ + 1) {
        paVar2 = *(aiNode **)(*(long *)(name_local[1].data + 0x50) + (ulong)pChild._4_4_ * 8);
        aiString::aiString(&local_43c,name);
        paVar2 = findNode(this,paVar2,&local_43c);
        if (paVar2 != (aiNode *)0x0) {
          return paVar2;
        }
        local_38 = 0;
      }
      this_local = (M3DImporter *)0x0;
    }
    return (aiNode *)this_local;
  }
  __assert_fail("mScene != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x27b,"aiNode *Assimp::M3DImporter::findNode(aiNode *, aiString)");
}

Assistant:

aiNode *M3DImporter::findNode(aiNode *pNode, aiString name) {
	unsigned int i;

	ai_assert(pNode != nullptr);
	ai_assert(mScene != nullptr);

	if (pNode->mName == name)
		return pNode;
	for (i = 0; i < pNode->mNumChildren; i++) {
		aiNode *pChild = findNode(pNode->mChildren[i], name);
		if (pChild) return pChild;
	}
	return nullptr;
}